

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase196::run(TestCase196 *this)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  ArrayPtr<unsigned_char> AVar3;
  unsigned_long *local_128;
  uchar *local_120;
  bool local_111;
  unsigned_long *puStack_110;
  bool _kj_shouldLog_4;
  uint64_t *i3;
  unsigned_long *local_100;
  bool local_f1;
  undefined1 auStack_f0 [7];
  bool _kj_shouldLog_3;
  ArrayPtr<unsigned_char> remaining;
  size_t spaceLeft;
  unsigned_long *local_d0;
  bool local_c1;
  unsigned_long *puStack_c0;
  bool _kj_shouldLog_2;
  uint64_t *i2;
  unsigned_long *local_b0;
  bool local_a1;
  unsigned_long *puStack_a0;
  bool _kj_shouldLog_1;
  bool local_95;
  bool _kj_shouldLog;
  unsigned_long *local_88;
  uint64_t *i;
  undefined1 local_70 [8];
  Arena arena;
  byte scratch [64];
  TestCase196 *this_local;
  
  scratch._56_8_ = this;
  _i = arrayPtr<unsigned_char>((uchar *)&arena.currentChunk,0x40);
  Arena::Arena((Arena *)local_70,_i);
  local_88 = Arena::allocate<unsigned_long>((Arena *)local_70);
  if (local_88 < &arena.currentChunk) {
    local_95 = _::Debug::shouldLog(ERROR);
    while (local_95 != false) {
      puStack_a0 = local_88;
      _::Debug::log<char_const(&)[60],unsigned_char*,unsigned_char(&)[64]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xcd,ERROR,
                 "\"failed: expected \" \"(reinterpret_cast<byte*>(&i)) >= (scratch)\", reinterpret_cast<byte*>(&i), scratch"
                 ,(char (*) [60])"failed: expected (reinterpret_cast<byte*>(&i)) >= (scratch)",
                 (uchar **)&stack0xffffffffffffff60,(uchar (*) [64])&arena.currentChunk);
      local_95 = false;
    }
  }
  if (scratch + 0x38 <= local_88) {
    local_a1 = _::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      local_b0 = local_88;
      i2 = (uint64_t *)(scratch + 0x38);
      _::Debug::log<char_const(&)[77],unsigned_char*,unsigned_char*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xce,ERROR,
                 "\"failed: expected \" \"(reinterpret_cast<byte*>(&i)) < (scratch + sizeof(scratch))\", reinterpret_cast<byte*>(&i), scratch + sizeof(scratch)"
                 ,(char (*) [77])
                  "failed: expected (reinterpret_cast<byte*>(&i)) < (scratch + sizeof(scratch))",
                 (uchar **)&local_b0,(uchar **)&i2);
      local_a1 = false;
    }
  }
  puStack_c0 = Arena::allocate<unsigned_long>((Arena *)local_70);
  if (local_88 + 1 != puStack_c0) {
    local_c1 = _::Debug::shouldLog(ERROR);
    while (local_c1 != false) {
      local_d0 = local_88 + 1;
      spaceLeft = (size_t)puStack_c0;
      _::Debug::log<char_const(&)[35],unsigned_long*,unsigned_long*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xd2,ERROR,"\"failed: expected \" \"(&i + 1) == (&i2)\", &i + 1, &i2",
                 (char (*) [35])"failed: expected (&i + 1) == (&i2)",&local_d0,
                 (unsigned_long **)&spaceLeft);
      local_c1 = false;
    }
  }
  remaining.size_ = (size_t)(scratch + (0x30 - (long)puStack_c0));
  AVar3 = Arena::allocateArray<unsigned_char>((Arena *)local_70,remaining.size_);
  remaining.ptr = (uchar *)AVar3.size_;
  _auStack_f0 = AVar3.ptr;
  puVar2 = puStack_c0 + 1;
  puVar1 = (unsigned_long *)ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)auStack_f0);
  if (puVar2 != puVar1) {
    local_f1 = _::Debug::shouldLog(ERROR);
    while (local_f1 != false) {
      local_100 = puStack_c0 + 1;
      i3 = (uint64_t *)ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)auStack_f0);
      _::Debug::log<char_const(&)[75],unsigned_char*,unsigned_char*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xd7,ERROR,
                 "\"failed: expected \" \"(reinterpret_cast<byte*>(&i2 + 1)) == (remaining.begin())\", reinterpret_cast<byte*>(&i2 + 1), remaining.begin()"
                 ,(char (*) [75])
                  "failed: expected (reinterpret_cast<byte*>(&i2 + 1)) == (remaining.begin())",
                 (uchar **)&local_100,(uchar **)&i3);
      local_f1 = false;
    }
  }
  puStack_110 = Arena::allocate<unsigned_long>((Arena *)local_70);
  puVar2 = (unsigned_long *)ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)auStack_f0);
  if (puVar2 == puStack_110) {
    local_111 = _::Debug::shouldLog(ERROR);
    while (local_111 != false) {
      local_120 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)auStack_f0);
      local_128 = puStack_110;
      _::Debug::log<char_const(&)[69],unsigned_char*,unsigned_char*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(remaining.end()) != (reinterpret_cast<byte*>(&i3))\", remaining.end(), reinterpret_cast<byte*>(&i3)"
                 ,(char (*) [69])
                  "failed: expected (remaining.end()) != (reinterpret_cast<byte*>(&i3))",&local_120,
                 (uchar **)&local_128);
      local_111 = false;
    }
  }
  Arena::~Arena((Arena *)local_70);
  return;
}

Assistant:

TEST(Arena, EndOfChunk) {
  union {
    byte scratch[64];
    uint64_t align;
  };
  Arena arena(arrayPtr(scratch, sizeof(scratch)));

  // First allocation will come from somewhere in the scratch space (after the chunk header).
  uint64_t& i = arena.allocate<uint64_t>();
  EXPECT_GE(reinterpret_cast<byte*>(&i), scratch);
  EXPECT_LT(reinterpret_cast<byte*>(&i), scratch + sizeof(scratch));

  // Next allocation will come at the next position.
  uint64_t& i2 = arena.allocate<uint64_t>();
  EXPECT_EQ(&i + 1, &i2);

  // Allocate the rest of the scratch space.
  size_t spaceLeft = scratch + sizeof(scratch) - reinterpret_cast<byte*>(&i2 + 1);
  ArrayPtr<byte> remaining = arena.allocateArray<byte>(spaceLeft);
  EXPECT_EQ(reinterpret_cast<byte*>(&i2 + 1), remaining.begin());

  // Next allocation comes from somewhere new.
  uint64_t& i3 = arena.allocate<uint64_t>();
  EXPECT_NE(remaining.end(), reinterpret_cast<byte*>(&i3));
}